

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::MaxId>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
               *cfc,ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + 3;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  pcVar2 = pBVar1->ptr_;
  sVar3 = pBVar1->size_;
  pcVar2[sVar3 + 2] = 'x';
  pcVar2 = pcVar2 + sVar3;
  pcVar2[0] = 'M';
  pcVar2[1] = 'a';
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar3 = pBVar1->size_;
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = '(';
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,int>
            (wrt,&cfc->args_,vnam);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + 2;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  pcVar2 = pBVar1->ptr_;
  sVar3 = pBVar1->size_;
  (pcVar2 + sVar3)[0] = ',';
  (pcVar2 + sVar3)[1] = ' ';
  pBVar1->size_ = uVar4;
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,0ul>,int>
            (wrt,(array<int,_0UL> *)&cfc->field_0x18);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar3 = pBVar1->size_;
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ')';
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt,
    const CustomConstraintData<A,P,I>& cfc,
    ItemNamer& vnam) {
  wrt << cfc.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, cfc.GetArguments(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, cfc.GetParameters());
  wrt << ')';
}